

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledRgbaInputFile::FromYa::FromYa(FromYa *this,TiledInputFile *inputFile)

{
  uint uVar1;
  Header *pHVar2;
  TileDescription *pTVar3;
  undefined8 local_20;
  float local_18;
  
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  this->_inputFile = inputFile;
  (this->_buf)._sizeX = 0;
  (this->_buf)._sizeY = 0;
  (this->_buf)._data = (Rgba *)0x0;
  pHVar2 = TiledInputFile::header(inputFile);
  pTVar3 = Header::tileDescription(pHVar2);
  uVar1 = pTVar3->ySize;
  this->_tileXSize = pTVar3->xSize;
  this->_tileYSize = uVar1;
  pHVar2 = TiledInputFile::header(this->_inputFile);
  anon_unknown_23::ywFromHeader((anon_unknown_23 *)&local_20,pHVar2);
  (this->_yw).x = (float)(undefined4)local_20;
  (this->_yw).y = (float)local_20._4_4_;
  (this->_yw).z = local_18;
  Array2D<Imf_3_4::Rgba>::resizeErase(&this->_buf,(ulong)this->_tileYSize,(ulong)this->_tileXSize);
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  return;
}

Assistant:

TiledRgbaInputFile::FromYa::FromYa (TiledInputFile& inputFile)
    : _inputFile (inputFile)
{
    const TileDescription& td = inputFile.header ().tileDescription ();

    _tileXSize = td.xSize;
    _tileYSize = td.ySize;
    _yw        = ywFromHeader (_inputFile.header ());
    _buf.resizeErase (_tileYSize, _tileXSize);
    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}